

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

_Bool rf_check_collision_ray_box(rf_ray ray,rf_bounding_box box)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined4 uVar4;
  float fVar5;
  undefined4 uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  dVar8 = (double)((box.min.x - ray.position.x) / ray.direction.x);
  dVar1 = (double)((box.max.x - ray.position.x) / ray.direction.x);
  dVar10 = dVar1;
  if (dVar8 <= dVar1) {
    dVar10 = dVar8;
  }
  dVar3 = (double)(~-(ulong)NAN(dVar8) & (ulong)dVar10 | -(ulong)NAN(dVar8) & (ulong)dVar1);
  dVar2 = (double)((box.min.y - ray.position.y) / ray.direction.y);
  dVar10 = (double)((box.max.y - ray.position.y) / ray.direction.y);
  dVar7 = dVar10;
  if (dVar2 <= dVar10) {
    dVar7 = dVar2;
  }
  dVar7 = (double)(~-(ulong)NAN(dVar2) & (ulong)dVar7 | -(ulong)NAN(dVar2) & (ulong)dVar10);
  dVar11 = dVar7;
  if (dVar7 <= dVar3) {
    dVar11 = dVar3;
  }
  dVar3 = (double)(~-(ulong)NAN(dVar3) & (ulong)dVar11 | -(ulong)NAN(dVar3) & (ulong)dVar7);
  dVar9 = (double)((box.min.z - ray.position.z) / ray.direction.z);
  dVar7 = (double)((box.max.z - ray.position.z) / ray.direction.z);
  dVar11 = dVar7;
  if (dVar9 <= dVar7) {
    dVar11 = dVar9;
  }
  dVar11 = (double)(~-(ulong)NAN(dVar9) & (ulong)dVar11 | -(ulong)NAN(dVar9) & (ulong)dVar7);
  dVar12 = dVar11;
  if (dVar11 <= dVar3) {
    dVar12 = dVar3;
  }
  if (dVar1 <= dVar8) {
    dVar1 = dVar8;
  }
  if (dVar10 <= dVar2) {
    dVar10 = dVar2;
  }
  dVar8 = dVar10;
  if (dVar1 <= dVar10) {
    dVar8 = dVar1;
  }
  dVar1 = (double)(~-(ulong)NAN(dVar1) & (ulong)dVar8 | -(ulong)NAN(dVar1) & (ulong)dVar10);
  if (dVar7 <= dVar9) {
    dVar7 = dVar9;
  }
  uVar4 = SUB84(dVar7,0);
  uVar6 = (undefined4)((ulong)dVar7 >> 0x20);
  if (dVar1 <= dVar7) {
    uVar4 = SUB84(dVar1,0);
    uVar6 = (undefined4)((ulong)dVar1 >> 0x20);
  }
  fVar5 = (float)(double)(-(ulong)NAN(dVar1) & (ulong)dVar7 |
                         ~-(ulong)NAN(dVar1) & CONCAT44(uVar6,uVar4));
  return (_Bool)(-(0.0 <= fVar5) &
                 -((float)(double)(-(ulong)NAN(dVar3) & (ulong)dVar11 |
                                  ~-(ulong)NAN(dVar3) & (ulong)dVar12) <= fVar5) & 1);
}

Assistant:

RF_API bool rf_check_collision_ray_box(rf_ray ray, rf_bounding_box box)
{
    bool collision = false;

    float t[8];
    t[0] = (box.min.x - ray.position.x) / ray.direction.x;
    t[1] = (box.max.x - ray.position.x) / ray.direction.x;
    t[2] = (box.min.y - ray.position.y) / ray.direction.y;
    t[3] = (box.max.y - ray.position.y) / ray.direction.y;
    t[4] = (box.min.z - ray.position.z) / ray.direction.z;
    t[5] = (box.max.z - ray.position.z) / ray.direction.z;
    t[6] = (float) fmax(fmax(fmin(t[0], t[1]), fmin(t[2], t[3])), fmin(t[4], t[5]));
    t[7] = (float) fmin(fmin(fmax(t[0], t[1]), fmax(t[2], t[3])), fmax(t[4], t[5]));

    collision = !(t[7] < 0 || t[6] > t[7]);

    return collision;
}